

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

double BinaryenConstGetValueF64(BinaryenExpressionRef expr)

{
  bool bVar1;
  double dVar2;
  Expression *expression;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Const>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xaf1,"double BinaryenConstGetValueF64(BinaryenExpressionRef)");
  }
  dVar2 = wasm::Literal::getf64((Literal *)(expr + 1));
  return dVar2;
}

Assistant:

double BinaryenConstGetValueF64(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return static_cast<Const*>(expression)->value.getf64();
}